

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O3

void highbd_quantize_fp_helper_c
               (tran_low_t *coeff_ptr,intptr_t count,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan,qm_val_t *qm_ptr,qm_val_t *iqm_ptr,int log_scale)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  short sVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  int local_50 [8];
  int log_scaled_round_arr [2];
  
  bVar3 = (byte)iscan;
  if (eob_ptr == (uint16_t *)0x0 && scan == (int16_t *)0x0) {
    iVar2 = (1 << (bVar3 & 0x1f)) >> 1;
    local_50[0] = *zbin_ptr + iVar2 >> (bVar3 & 0x1f);
    local_50[1] = zbin_ptr[1] + iVar2 >> (bVar3 & 0x1f);
    if (0 < count) {
      uVar15 = 0xffffffff;
      uVar9 = 0;
      do {
        lVar12 = (long)dequant_ptr[uVar9];
        uVar7 = (ulong)(lVar12 != 0);
        iVar2 = coeff_ptr[lVar12];
        iVar14 = -iVar2;
        if (0 < iVar2) {
          iVar14 = iVar2;
        }
        iVar4 = (int)*(short *)((long)qcoeff_ptr + uVar7 * 2);
        if (iVar14 << (bVar3 + 1 & 0x1f) < iVar4) {
          iVar2 = 0;
          iVar14 = 0;
        }
        else {
          uVar5 = iVar2 >> 0x1f;
          uVar6 = (uint)(((long)iVar14 + (long)local_50[uVar7]) * (long)round_ptr[uVar7] >>
                        (0x10 - bVar3 & 0x3f));
          iVar2 = (uVar5 ^ uVar6) - uVar5;
          if (uVar6 != 0) {
            uVar15 = uVar9 & 0xffffffff;
          }
          iVar14 = ((int)(iVar4 * uVar6) >> (bVar3 & 0x1f) ^ uVar5) - uVar5;
        }
        sVar8 = (short)uVar15;
        *(int *)(quant_ptr + lVar12 * 2) = iVar2;
        *(int *)(quant_shift_ptr + lVar12 * 2) = iVar14;
        uVar9 = uVar9 + 1;
      } while (count != uVar9);
      goto LAB_00193f7c;
    }
  }
  else if (0 < count) {
    uVar9 = 0xffffffff;
    uVar15 = 0;
    do {
      sVar8 = dequant_ptr[uVar15];
      lVar12 = (long)sVar8;
      if (eob_ptr == (uint16_t *)0x0) {
        uVar7 = 0x20;
      }
      else {
        uVar7 = (ulong)*(byte *)((long)eob_ptr + lVar12);
      }
      if (scan == (int16_t *)0x0) {
        uVar5 = 0x20;
      }
      else {
        uVar5 = (uint)*(byte *)((long)scan + lVar12);
      }
      iVar2 = coeff_ptr[lVar12];
      iVar14 = -iVar2;
      if (0 < iVar2) {
        iVar14 = iVar2;
      }
      iVar11 = (int)*(short *)((long)qcoeff_ptr + (ulong)(sVar8 != 0) * 2);
      bVar1 = 4 - bVar3 & 0x1f;
      iVar4 = 0 << bVar1;
      if ((long)(uVar7 * (long)iVar14) < (long)(iVar11 << bVar1)) {
        iVar2 = 0;
      }
      else {
        uVar13 = iVar2 >> 0x1f;
        uVar10 = (ulong)((uint)(sVar8 != 0) * 2);
        uVar6 = (uint)((long)(uVar7 * (long)*(short *)((long)round_ptr + uVar10) *
                             ((long)((int)*(short *)((long)zbin_ptr + uVar10) +
                                     ((1 << (bVar3 & 0x1f)) >> 1) >> (bVar3 & 0x1f)) + (long)iVar14)
                             ) >> (0x15 - bVar3 & 0x3f));
        iVar4 = (uVar13 ^ uVar6) - uVar13;
        iVar2 = ((int)(((int)(uVar5 * iVar11 + 0x10) >> 5) * uVar6) >> (bVar3 & 0x1f) ^ uVar13) -
                uVar13;
        if (uVar6 != 0) {
          uVar9 = uVar15 & 0xffffffff;
        }
      }
      sVar8 = (short)uVar9;
      *(int *)(quant_ptr + lVar12 * 2) = iVar4;
      *(int *)(quant_shift_ptr + lVar12 * 2) = iVar2;
      uVar15 = uVar15 + 1;
    } while (count != uVar15);
    goto LAB_00193f7c;
  }
  sVar8 = -1;
LAB_00193f7c:
  *(short *)dqcoeff_ptr = sVar8 + 1;
  return;
}

Assistant:

static void highbd_quantize_fp_helper_c(
    const tran_low_t *coeff_ptr, intptr_t count, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan, const qm_val_t *qm_ptr,
    const qm_val_t *iqm_ptr, int log_scale) {
  int i;
  int eob = -1;
  const int shift = 16 - log_scale;
  // TODO(jingning) Decide the need of these arguments after the
  // quantization process is completed.
  (void)zbin_ptr;
  (void)quant_shift_ptr;
  (void)iscan;

  if (qm_ptr || iqm_ptr) {
    // Quantization pass: All coefficients with index >= zero_flag are
    // skippable. Note: zero_flag can be zero.
    for (i = 0; i < count; i++) {
      const int rc = scan[i];
      const int coeff = coeff_ptr[rc];
      const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
      const qm_val_t iwt = iqm_ptr != NULL ? iqm_ptr[rc] : (1 << AOM_QM_BITS);
      const int dequant =
          (dequant_ptr[rc != 0] * iwt + (1 << (AOM_QM_BITS - 1))) >>
          AOM_QM_BITS;
      const int coeff_sign = AOMSIGN(coeff);
      const int64_t abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      int abs_qcoeff = 0;
      if (abs_coeff * wt >=
          (dequant_ptr[rc != 0] << (AOM_QM_BITS - (1 + log_scale)))) {
        const int64_t tmp =
            abs_coeff + ROUND_POWER_OF_TWO(round_ptr[rc != 0], log_scale);
        abs_qcoeff =
            (int)((tmp * quant_ptr[rc != 0] * wt) >> (shift + AOM_QM_BITS));
        qcoeff_ptr[rc] = (tran_low_t)((abs_qcoeff ^ coeff_sign) - coeff_sign);
        const tran_low_t abs_dqcoeff = (abs_qcoeff * dequant) >> log_scale;
        dqcoeff_ptr[rc] = (tran_low_t)((abs_dqcoeff ^ coeff_sign) - coeff_sign);
        if (abs_qcoeff) eob = i;
      } else {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
      }
    }
  } else {
    const int log_scaled_round_arr[2] = {
      ROUND_POWER_OF_TWO(round_ptr[0], log_scale),
      ROUND_POWER_OF_TWO(round_ptr[1], log_scale),
    };
    for (i = 0; i < count; i++) {
      const int rc = scan[i];
      const int coeff = coeff_ptr[rc];
      const int rc01 = (rc != 0);
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int log_scaled_round = log_scaled_round_arr[rc01];
      if ((abs_coeff << (1 + log_scale)) >= dequant_ptr[rc01]) {
        const int quant = quant_ptr[rc01];
        const int dequant = dequant_ptr[rc01];
        const int64_t tmp = (int64_t)abs_coeff + log_scaled_round;
        const int abs_qcoeff = (int)((tmp * quant) >> shift);
        qcoeff_ptr[rc] = (tran_low_t)((abs_qcoeff ^ coeff_sign) - coeff_sign);
        const tran_low_t abs_dqcoeff = (abs_qcoeff * dequant) >> log_scale;
        if (abs_qcoeff) eob = i;
        dqcoeff_ptr[rc] = (tran_low_t)((abs_dqcoeff ^ coeff_sign) - coeff_sign);
      } else {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
      }
    }
  }
  *eob_ptr = eob + 1;
}